

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeTransformMatrixAtPoint
          (ChElementBeamTaperedTimoshenko *this,ChMatrixDynamic<> *mT,double eta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  double *pdVar15;
  char *__function;
  Index *dst;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChMatrix33<double> RotsectA;
  ChMatrixNM<double,_6,_6> Tc;
  ChMatrixNM<double,_6,_6> Ts;
  ChMatrixNM<double,_6,_6> Rotsect;
  undefined1 auStack_524 [8];
  undefined1 auStack_51c [8];
  undefined1 auStack_514 [12];
  double local_508;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  undefined1 local_4e0 [16];
  double local_4c8 [6];
  double local_498;
  undefined8 local_490;
  double local_488;
  Matrix<double,_6,_6,_1,_6,_6> local_480;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
  local_318;
  Matrix<double,_6,_6,_1,_6,_6> local_300;
  double adStack_1d0 [2];
  Matrix<double,_6,_6,_1,_6,_6> local_1c0;
  undefined1 extraout_var [56];
  
  unique0x100016bd = eta;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)mT,0x24,6,6);
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_4e8 = (double)(**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                             super_ChBeamSectionEulerAdvancedGeneric.
                                             super_ChBeamSectionEuler + 0x30))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_330 = (**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                     super_ChBeamSectionEulerAdvancedGeneric.
                                     super_ChBeamSectionEuler + 0x38))();
  uStack_328 = extraout_XMM0_Qb;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_340 = (**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                     super_ChBeamSectionEulerAdvancedGeneric.
                                     super_ChBeamSectionEuler + 0x40))();
  uStack_338 = extraout_XMM0_Qb_00;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_4f0 = (double)(**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                             super_ChBeamSectionEulerAdvancedGeneric.
                                             super_ChBeamSectionEuler + 0x48))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_4e0._0_8_ =
       (**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler +
                   0x50))();
  local_4e0._8_8_ = extraout_XMM0_Qb_01;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_4f8 = (double)(**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                             super_ChBeamSectionEulerAdvancedGeneric.
                                             super_ChBeamSectionEuler + 0x30))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_500 = (double)(**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                             super_ChBeamSectionEulerAdvancedGeneric.
                                             super_ChBeamSectionEuler + 0x38))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_508 = (double)(**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                             super_ChBeamSectionEulerAdvancedGeneric.
                                             super_ChBeamSectionEuler + 0x40))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  auStack_514._4_8_ =
       (**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler +
                   0x48))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  peVar5 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar6 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var7 = (peVar5->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  register0x00001200 =
       (double)(**(code **)(*(long *)&(peVar6->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x50))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  dVar8 = (1.0 - stack0xfffffffffffffae0) * 0.5;
  dVar9 = (stack0xfffffffffffffae0 + 1.0) * 0.5;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_4e8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar9 * local_4f8;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar8;
  auVar16 = vfmadd213sd_fma(auVar25,auVar27,auVar16);
  local_4e8 = auVar16._0_8_;
  local_500 = dVar9 * local_500;
  local_4f8 = dVar9 * local_508;
  local_508 = dVar9 * (double)auStack_514._4_8_;
  unique0x000f7500 = dVar9 * register0x00001200;
  unique0x100016c5 = dVar8;
  auStack_514._4_8_ = cos(local_4e8);
  auVar20._0_8_ = sin(local_4e8);
  auVar20._8_56_ = extraout_var;
  local_4c8[0] = 1.0;
  local_4c8[1] = 0.0;
  local_4c8[2] = -0.0;
  dVar8 = auVar20._0_8_ * 0.0;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auStack_514._4_8_;
  dVar9 = (double)auStack_514._4_8_ * 0.0;
  local_4c8[3] = dVar8 - dVar9;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar8;
  auVar16 = vfmadd213sd_fma(ZEXT816(0),auVar24,auVar28);
  local_4c8[4] = (double)auVar16._0_8_;
  local_4c8[5] = auVar20._0_8_;
  local_498 = dVar9 + dVar8;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar9;
  auVar16 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar26,auVar20._0_16_);
  local_490 = auVar16._0_8_;
  local_488 = (double)auStack_514._4_8_;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xe]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7] =
       0.0;
  lVar14 = 0;
  do {
    uVar11 = *(undefined8 *)((long)local_4c8 + lVar14 + 8);
    *(undefined8 *)
     ((long)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + lVar14 * 2) = *(undefined8 *)((long)local_4c8 + lVar14);
    *(undefined8 *)
     ((long)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + lVar14 * 2 + 8) = uVar11;
    *(undefined8 *)
     ((long)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + lVar14 * 2 + 0x10) = *(undefined8 *)((long)local_4c8 + lVar14 + 0x10);
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x48);
  auVar13._8_8_ = uStack_328;
  auVar13._0_8_ = local_330;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = stack0xfffffffffffffae0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_500;
  auVar16 = vfmadd213sd_fma(auVar13,auVar21,auVar1);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_4f0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_508;
  auVar24 = vfmadd213sd_fma(auVar17,auVar21,auVar2);
  local_4f0 = auVar24._0_8_;
  lVar14 = 0x5c;
  auVar12._8_8_ = uStack_338;
  auVar12._0_8_ = local_340;
  do {
    uVar11 = *(undefined8 *)(auStack_51c + lVar14);
    *(undefined8 *)((long)adStack_1d0 + lVar14 * 2) = *(undefined8 *)(auStack_524 + lVar14);
    *(undefined8 *)((long)adStack_1d0 + lVar14 * 2 + 8) = uVar11;
    *(undefined8 *)
     ((long)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + lVar14 * 2) = *(undefined8 *)(auStack_514 + lVar14);
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0xa4);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_4f8;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = stack0xfffffffffffffae0;
  auVar24 = vfmadd132sd_fma(auVar12,auVar18,auVar3);
  pdVar15 = (double *)&local_480;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xe]
       = 0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7] =
       0.0;
  lVar14 = 0;
  do {
    *pdVar15 = 1.0;
    lVar14 = lVar14 + 0x30;
    pdVar15 = pdVar15 + 7;
  } while (lVar14 != 0x120);
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4] =
       auVar24._0_8_;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xf]
       = auVar16._0_8_;
  auVar22._0_8_ =
       -local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
        array[0xf];
  auVar22._8_8_ = auVar16._8_8_ ^ 0x8000000000000000;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar22);
  auVar19._0_8_ =
       -local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
        array[4];
  auVar19._8_8_ = auVar24._8_8_ ^ 0x8000000000000000;
  local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlpd_avx(auVar19);
  if ((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      == 6) {
    local_318.m_lhs.m_rhs = (RhsNested)&this->Rc;
    dst = (Index *)&local_300;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
         = 0.0;
    local_318.m_lhs.m_lhs = &local_480;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_6,__1,_0,_6,__1> *)dst,(SrcXprType *)&local_318,
          (assign_op<double,_double> *)(auStack_524 + 3));
    if (local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
        array[1] != 2.96439387504748e-323) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 6, 6, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 6, 6, 1>]"
                   );
    }
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
         = *(double *)
            local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array[0];
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0x30);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0x60);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0x90);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0xc0);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0xf0);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 8);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0x38);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0x68);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
         = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 0x98);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [10] = *(double *)
            ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[0] + 200);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xb] = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                    .m_data.array[0] + 0xf8);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xc] = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                    .m_data.array[0] + 0x10);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xd] = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                    .m_data.array[0] + 0x40);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xe] = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                    .m_data.array[0] + 0x70);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = *(double *)
             ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                    .m_data.array[0] + 0xa0);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x10] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xd0);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x11] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x100);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x12] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x18);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x13] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x48);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x14] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x78);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x15] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xa8);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x16] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xd8);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x17] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x108);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x18] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x20);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x19] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x50);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1a] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x80);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1b] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xb0);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1c] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xe0);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1d] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x110);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1e] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x28);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1f] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x58);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x20] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x88);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x21] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xb8);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x22] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0xe8);
    local_480.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x23] = *(double *)
              ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0] + 0x118);
    if ((double *)
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
        array[0] != (double *)0x0) {
      free(*(void **)((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                            m_storage.m_data.array[0] + -8));
    }
    auVar23._8_8_ = 0;
    auVar23._0_8_ = stack0xfffffffffffffae8;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = stack0xfffffffffffffae0;
    local_4e0 = vfmadd132sd_fma(local_4e0,auVar23,auVar4);
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x20] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x21] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x22] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x23] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x18] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x19] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1a] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1b] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1c] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1d] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1e] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1f] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x10] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x11] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x12] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x13] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x14] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x15] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x16] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x17] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [10] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xb] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xc] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xd] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xe] = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7]
         = 0.0;
    lVar14 = 0;
    do {
      *dst = 0x3ff0000000000000;
      lVar14 = lVar14 + 0x30;
      dst = dst + 7;
    } while (lVar14 != 0x120);
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(local_4e0,auVar10);
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
         = (double)vmovlpd_avx(auVar16);
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = local_4f0;
    if ((this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        == 6) {
      local_318.m_lhs.m_lhs = (LhsNested)&this->Rs;
      local_318.m_lhs.m_rhs = &local_300;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                (&local_300,
                 (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                  *)&local_318,(assign_op<double,_double> *)(auStack_524 + 3),(type)0x0);
      local_318.m_lhs.m_lhs = &local_1c0;
      local_318.m_lhs.m_rhs = &local_300;
      local_318.m_rhs = &local_480;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                (mT,&local_318,(assign_op<double,_double> *)(auStack_524 + 3),(type)0x0);
      return;
    }
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 6, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 6, 6, 1>, Option = 0]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, 6, 6, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 6, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeTransformMatrixAtPoint(ChMatrixDynamic<>& mT, const double eta) {
    mT.resize(6, 6);

    double alpha1 = this->tapered_section->GetSectionA()->GetSectionRotation();
    double Cy1 = this->tapered_section->GetSectionA()->GetCentroidY();
    double Cz1 = this->tapered_section->GetSectionA()->GetCentroidZ();
    double Sy1 = this->tapered_section->GetSectionA()->GetShearCenterY();
    double Sz1 = this->tapered_section->GetSectionA()->GetShearCenterZ();

    double alpha2 = this->tapered_section->GetSectionB()->GetSectionRotation();
    double Cy2 = this->tapered_section->GetSectionB()->GetCentroidY();
    double Cz2 = this->tapered_section->GetSectionB()->GetCentroidZ();
    double Sy2 = this->tapered_section->GetSectionB()->GetShearCenterY();
    double Sz2 = this->tapered_section->GetSectionB()->GetShearCenterZ();

    // double L = this->length;

    // The shear center offset is respect to the centerline of beam element.
    /*Sy1 = Sy1 - Cy1;  // Unnecessary to do this substraction
    Sz1 = Sz1 - Cz1;
    Sy2 = Sy2 - Cy2;
    Sz2 = Sz2 - Cz2;*/

    // calculate the orientation angle and centers by linear interpolation
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double alpha = Nx1 * alpha1 + Nx2 * alpha2;
    double Cy = Nx1 * Cy1 + Nx2 * Cy2;
    double Cz = Nx1 * Cz1 + Nx2 * Cz2;
    double Sy = Nx1 * Sy1 + Nx2 * Sy2;
    double Sz = Nx1 * Sz1 + Nx2 * Sz2;

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(alpha, 0, 0));
    ChMatrixNM<double, 6, 6> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;

    // In case the section has a centroid displacement:
    ChMatrixNM<double, 6, 6> Tc;
    Tc.setIdentity();
    Tc(0, 4) = Cz;
    Tc(0, 5) = -Cy;
    Tc(1, 3) = -Cz;
    Tc(2, 3) = Cy;

    Tc = Tc * this->Rc;

    // In case the section has a shear center displacement:
    ChMatrixNM<double, 6, 6> Ts;
    Ts.setIdentity();
    Ts(1, 3) = -Sz;
    Ts(2, 3) = Sy;

    Ts = this->Rs * Ts;

    // the transformation matrix at point eta:
    mT = Rotsect * Ts * Tc;
}